

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rvm.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  int i;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  void *pvVar10;
  ulong uVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  Extractor ex;
  Mat r1i;
  float norm_vals2 [3];
  float mean_vals2 [3];
  float norm_vals1 [3];
  float mean_vals1 [3];
  Mat cv_pha;
  long local_478;
  long *local_440;
  Net net;
  Mat cv_fgr;
  int local_3c0;
  int iStack_3bc;
  long local_3b8;
  long *local_380;
  Mat r2i;
  Mat r4i;
  Mat m;
  int local_2d0;
  int local_2cc;
  uchar *local_2c8;
  Mat fgr_;
  Mat r3i;
  Mat pha_;
  Mat ncnn_in1;
  Mat ncnn_in2;
  Mat pha;
  undefined8 *local_b0;
  Mat fgr;
  
  if (argc == 2) {
    pcVar1 = argv[1];
    std::__cxx11::string::string((string *)&cv_pha,pcVar1,(allocator *)&cv_fgr);
    cv::imread((string *)&m,(int)&cv_pha);
    std::__cxx11::string::~string((string *)&cv_pha);
    cVar2 = cv::Mat::empty();
    if (cVar2 == '\0') {
      cv::Mat::Mat(&fgr);
      cv::Mat::Mat(&pha);
      ncnn::Net::Net(&net);
      net.opt.use_vulkan_compute = false;
      ncnn::Net::load_param(&net,"rvm_512.param");
      ncnn::Net::load_model(&net,"rvm_512.bin");
      ncnn::Mat::Mat(&r1i,0x80,0x80,0x10,4,(Allocator *)0x0);
      ncnn::Mat::Mat(&r2i,0x40,0x40,0x14,4,(Allocator *)0x0);
      ncnn::Mat::Mat(&r3i,0x20,0x20,0x28,4,(Allocator *)0x0);
      ncnn::Mat::Mat(&r4i,0x10,0x10,0x40,4,(Allocator *)0x0);
      ncnn::Mat::fill(&r1i,0.0);
      ncnn::Mat::fill(&r2i,0.0);
      ncnn::Mat::fill(&r3i,0.0);
      ncnn::Mat::fill(&r4i,0.0);
      ncnn::Net::create_extractor((Net *)&ex);
      mean_vals1[0] = 123.675;
      mean_vals1[1] = 116.28;
      mean_vals1[2] = 103.53;
      mean_vals2[2] = 0.0;
      mean_vals2[0] = 0.0;
      mean_vals2[1] = 0.0;
      norm_vals1[0] = 0.01712475;
      norm_vals1[1] = 0.0175;
      norm_vals1[2] = 0.01742919;
      norm_vals2[0] = 0.003921569;
      norm_vals2[1] = 0.003921569;
      norm_vals2[2] = 0.003921569;
      ncnn::Mat::from_pixels_resize
                (&ncnn_in2,local_2c8,0x10002,local_2cc,local_2d0,0x200,0x200,(Allocator *)0x0);
      ncnn::Mat::from_pixels_resize
                (&ncnn_in1,local_2c8,0x10002,local_2cc,local_2d0,0x100,0x100,(Allocator *)0x0);
      ncnn::Mat::substract_mean_normalize(&ncnn_in1,mean_vals1,norm_vals1);
      ncnn::Mat::substract_mean_normalize(&ncnn_in2,mean_vals2,norm_vals2);
      ncnn::Extractor::input(&ex,"src1",&ncnn_in1);
      ncnn::Extractor::input(&ex,"src2",&ncnn_in2);
      ncnn::Extractor::input(&ex,"r1i",&r1i);
      ncnn::Extractor::input(&ex,"r2i",&r2i);
      ncnn::Extractor::input(&ex,"r3i",&r3i);
      ncnn::Extractor::input(&ex,"r4i",&r4i);
      ncnn::Extractor::extract(&ex,"r4o",&r4i,0);
      ncnn::Extractor::extract(&ex,"r3o",&r3i,0);
      ncnn::Extractor::extract(&ex,"r2o",&r2i,0);
      ncnn::Extractor::extract(&ex,"r1o",&r1i,0);
      pha_.cstep = 0;
      pha_.data = (void *)0x0;
      pha_.refcount._0_4_ = 0;
      pha_.refcount._4_4_ = 0;
      pha_._16_12_ = SUB1612((undefined1  [16])0x0,4);
      pha_._32_12_ = SUB1612((undefined1  [16])0x0,0);
      pha_.w = 0;
      pha_.h = 0;
      pha_.d = 0;
      pha_.c = 0;
      ncnn::Extractor::extract(&ex,"pha",&pha_,0);
      fgr_.cstep = 0;
      fgr_.data = (void *)0x0;
      fgr_.refcount._0_4_ = 0;
      fgr_.refcount._4_4_ = 0;
      fgr_._16_12_ = SUB1612((undefined1  [16])0x0,4);
      fgr_._32_12_ = SUB1612((undefined1  [16])0x0,0);
      fgr_.w = 0;
      fgr_.h = 0;
      fgr_.d = 0;
      fgr_.c = 0;
      ncnn::Extractor::extract(&ex,"fgr",&fgr_,0);
      cv::Mat::Mat(&cv_pha,pha_.h,pha_.w,5,pha_.data,0);
      cv::Mat::Mat(&cv_fgr,fgr_.h,fgr_.w,0x15);
      uVar5 = 0;
      uVar7 = 0;
      if (0 < fgr_.w) {
        uVar7 = (ulong)(uint)fgr_.w;
      }
      uVar8 = 0;
      if (0 < fgr_.h) {
        uVar8 = (ulong)(uint)fgr_.h;
      }
      iVar3 = fgr_.h * fgr_.w;
      iVar9 = iVar3 * 2;
      pvVar10 = fgr_.data;
      for (; uVar5 != uVar8; uVar5 = uVar5 + 1) {
        lVar4 = local_3b8 + 8;
        for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
          lVar12 = *local_380 * uVar5;
          *(undefined4 *)(lVar4 + lVar12) = *(undefined4 *)((long)pvVar10 + uVar11 * 4);
          *(undefined4 *)(lVar4 + -4 + lVar12) =
               *(undefined4 *)((long)fgr_.data + uVar11 * 4 + (long)iVar3 * 4);
          *(undefined4 *)(lVar4 + -8 + lVar12) =
               *(undefined4 *)((long)fgr_.data + uVar11 * 4 + (long)iVar9 * 4);
          lVar4 = lVar4 + 0xc;
        }
        iVar9 = iVar9 + fgr_.w;
        iVar3 = iVar3 + fgr_.w;
        pvVar10 = (void *)((long)pvVar10 + (long)fgr_.w * 4);
      }
      cv::Mat::copyTo((_OutputArray *)&cv_pha);
      cv::Mat::copyTo((_OutputArray *)&cv_fgr);
      cv::Mat::~Mat(&cv_fgr);
      cv::Mat::~Mat(&cv_pha);
      ncnn::Mat::~Mat(&fgr_);
      ncnn::Mat::~Mat(&pha_);
      ncnn::Mat::~Mat(&ncnn_in1);
      ncnn::Mat::~Mat(&ncnn_in2);
      ncnn::Extractor::~Extractor(&ex);
      ncnn::Mat::~Mat(&r4i);
      ncnn::Mat::~Mat(&r3i);
      ncnn::Mat::~Mat(&r2i);
      ncnn::Mat::~Mat(&r1i);
      ncnn::Net::~Net(&net);
      cv::Mat::Mat(&cv_pha);
      _cv_fgr = 0x2010000;
      cv::Mat::convertTo((_OutputArray *)&fgr,(int)&cv_fgr,255.0,0.0);
      cv::Mat::Mat(&cv_fgr);
      net.opt.blob_allocator = (Allocator *)0x0;
      net._vptr_Net._0_4_ = 0x2010000;
      net.opt._0_8_ = &cv_fgr;
      cv::Mat::convertTo((_OutputArray *)&pha,(int)&net,255.0,0.0);
      cv::Mat::Mat((Mat *)&net);
      r1i.elemsize = 0;
      r1i.data._0_4_ = 0x1010000;
      r2i.elemsize = 0;
      r1i.refcount = (int *)&m;
      r2i.data._0_4_ = 0x2010000;
      r3i.data = (void *)CONCAT44((int)*local_b0,(int)((ulong)*local_b0 >> 0x20));
      r2i.refcount = (int *)&net;
      cv::resize(0,0);
      for (lVar4 = 0; local_3c0 = (int)&cv_pha, lVar4 < local_3c0; lVar4 = lVar4 + 1) {
        lVar12 = 2;
        for (lVar6 = 0; iStack_3bc = (int)((ulong)&cv_pha >> 0x20), lVar6 < iStack_3bc;
            lVar6 = lVar6 + 1) {
          fVar13 = (float)*(byte *)(lVar6 + *local_380 * lVar4) / 255.0;
          fVar14 = 1.0 - fVar13;
          *(char *)((long)net.opt.blob_allocator + lVar12 + -2 + (long)(net.d)->opt * lVar4) =
               (char)(int)((float)*(byte *)(lVar12 + -2 + *local_440 * lVar4 + local_478) * fVar13 +
                          fVar14 * 155.0);
          *(char *)((long)net.opt.blob_allocator + lVar12 + -1 + (long)(net.d)->opt * lVar4) =
               (char)(int)((float)*(byte *)(lVar12 + -1 + *local_440 * lVar4 + local_478) * fVar13 +
                          fVar14 * 255.0);
          *(char *)((long)&(net.opt.blob_allocator)->_vptr_Allocator +
                   lVar12 + (long)(net.d)->opt * lVar4) =
               (char)(int)((float)*(byte *)(lVar12 + *local_440 * lVar4 + local_478) * fVar13 +
                          fVar14 * 120.0);
          lVar12 = lVar12 + 3;
        }
      }
      std::__cxx11::string::string((string *)&r1i,"pha",(allocator *)&r4i);
      r2i.elemsize = 0;
      r2i.data._0_4_ = 0x1010000;
      r2i.refcount = (int *)&cv_fgr;
      cv::imshow((string *)&r1i,(_InputArray *)&r2i);
      std::__cxx11::string::~string((string *)&r1i);
      std::__cxx11::string::string((string *)&r1i,"fgr",(allocator *)&r4i);
      r2i.elemsize = 0;
      r2i.data._0_4_ = 0x1010000;
      r2i.refcount = (int *)&cv_pha;
      cv::imshow((string *)&r1i,(_InputArray *)&r2i);
      std::__cxx11::string::~string((string *)&r1i);
      std::__cxx11::string::string((string *)&r1i,"comp",(allocator *)&r4i);
      r2i.elemsize = 0;
      r2i.data._0_4_ = 0x1010000;
      r2i.refcount = (int *)&net;
      cv::imshow((string *)&r1i,(_InputArray *)&r2i);
      std::__cxx11::string::~string((string *)&r1i);
      iVar9 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&net);
      cv::Mat::~Mat(&cv_fgr);
      cv::Mat::~Mat(&cv_pha);
      cv::Mat::~Mat(&pha);
      cv::Mat::~Mat(&fgr);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar1);
      iVar9 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar9 = -1;
  }
  return iVar9;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    cv::Mat fgr, pha;
    detect_rvm(m, pha, fgr);
    draw_objects(m, fgr, pha);

    return 0;
}